

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

string * jsonnet::internal::uop_string_abi_cxx11_(UnaryOp uop)

{
  ostream *this;
  void *this_00;
  int in_ESI;
  string *in_RDI;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe1);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe2);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff3);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
    break;
  default:
    this = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unrecognised unary operator: ");
    this_00 = (void *)std::ostream::operator<<(this,in_ESI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    abort();
  }
  return in_RDI;
}

Assistant:

static inline std::string uop_string(UnaryOp uop)
{
    switch (uop) {
        case UOP_PLUS: return "+";
        case UOP_MINUS: return "-";
        case UOP_BITWISE_NOT: return "~";
        case UOP_NOT: return "!";

        default:
            std::cerr << "INTERNAL ERROR: Unrecognised unary operator: " << uop << std::endl;
            std::abort();
    }
}